

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O2

void __thiscall iDynTree::AttitudeQuaternionEKF::serializeStateVector(AttitudeQuaternionEKF *this)

{
  size_t sVar1;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> x;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> b;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> Omega;
  Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_> q;
  PointerType local_98;
  Index IStack_90;
  undefined1 local_88;
  Vector3 *local_80 [2];
  Vector3 *local_70 [2];
  AttitudeEstimatorState *local_60 [2];
  undefined1 local_50 [24];
  Index IStack_38;
  undefined1 local_30;
  variable_if_dynamic<long,__1> local_28;
  Index local_18;
  
  toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_98,
          &this->m_x);
  local_60[0] = &this->m_state_qekf;
  local_70[0] = &(this->m_state_qekf).m_angular_velocity;
  local_80[0] = &(this->m_state_qekf).m_gyroscope_bias;
  sVar1 = iDynTree::VectorDynSize::size();
  if (sVar1 != this->m_state_size) {
    iDynTree::VectorDynSize::resize((ulong)&this->m_x);
  }
  local_50._0_8_ = local_98;
  local_50._16_8_ = local_98;
  IStack_38 = IStack_90;
  local_30 = local_88;
  local_28.m_value = 0;
  local_18 = IStack_90;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,4,1,false>,Eigen::Map<Eigen::Matrix<double,4,1,0,4,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false>
              *)local_50,
             (Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_> *)local_60);
  local_50._0_8_ = local_98 + 4;
  local_50._16_8_ = local_98;
  IStack_38 = IStack_90;
  local_30 = local_88;
  local_28.m_value = 4;
  local_18 = IStack_90;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>
              *)local_50,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_70);
  local_50._0_8_ = local_98 + 7;
  local_50._16_8_ = local_98;
  IStack_38 = IStack_90;
  local_30 = local_88;
  local_28.m_value = 7;
  local_18 = IStack_90;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>
              *)local_50,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_80);
  return;
}

Assistant:

void iDynTree::AttitudeQuaternionEKF::serializeStateVector()
{
    using iDynTree::toEigen;
    auto x(toEigen(m_x));
    auto q(toEigen(m_state_qekf.m_orientation));
    auto Omega(toEigen(m_state_qekf.m_angular_velocity));
    auto b(toEigen(m_state_qekf.m_gyroscope_bias));

    if (m_x.size() != m_state_size)
    {
        m_x.resize(m_state_size);
    }

    x.block<4, 1>(0, 0) = q;
    x.block<3, 1>(4, 0) = Omega;
    x.block<3, 1>(7, 0) = b;
}